

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O0

void __thiscall FlatZinc::FlatZincSpace::printDomains(FlatZincSpace *this,ostream *out)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  IntVar **ppIVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  long lVar10;
  ostream *poVar11;
  mapped_type *pmVar12;
  ostream *in_RSI;
  long in_RDI;
  BoolView otherval;
  string bvstring;
  BoolView bview;
  uint i_1;
  int val;
  bool first;
  string varName;
  IntVar *var;
  uint i;
  bool outerFirst;
  undefined5 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  mapped_type *in_stack_fffffffffffffec0;
  key_type *in_stack_fffffffffffffed8;
  key_type *__k;
  mapped_type *in_stack_fffffffffffffee0;
  BoolView local_c0;
  string local_b0 [32];
  key_type local_90;
  reference local_80;
  uint local_70;
  int local_6c;
  byte local_65;
  undefined4 local_54;
  string local_50 [32];
  IntVar *local_30;
  reference local_28;
  uint local_18;
  byte local_11;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"{");
  local_11 = 1;
  for (local_18 = 0; uVar1 = local_18, uVar4 = vec<IntVar_*>::size((vec<IntVar_*> *)(in_RDI + 0x10))
      , uVar1 < uVar4; local_18 = local_18 + 1) {
    local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffec0,
                          CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_28);
    if (!bVar2) {
      ppIVar7 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x10),local_18);
      local_30 = *ppIVar7;
      pmVar8 = std::
               map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::__cxx11::string::string(local_50,(string *)pmVar8);
      uVar9 = std::__cxx11::string::empty();
      if (((uVar9 & 1) == 0) &&
         (lVar10 = std::__cxx11::string::find(local_50,0x322020), lVar10 != -1)) {
        if ((local_11 & 1) == 0) {
          std::operator<<(local_10,",");
        }
        local_11 = 0;
        poVar11 = std::operator<<(local_10,'\"');
        poVar11 = std::operator<<(poVar11,local_50);
        poVar11 = std::operator<<(poVar11,'\"');
        std::operator<<(poVar11,":");
        std::operator<<(local_10,"[");
        if (local_30->vals == (Tchar *)0x0) {
          poVar11 = std::operator<<(local_10,'[');
          iVar6 = IntVar::getMin((IntVar *)0x2875a5);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
          poVar11 = std::operator<<(poVar11,",");
          iVar6 = IntVar::getMax((IntVar *)0x2875dd);
          poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar6);
          std::operator<<(poVar11,']');
        }
        else {
          local_65 = 1;
          for (local_6c = IntVar::getMin((IntVar *)0x2874c5); iVar6 = local_6c,
              iVar5 = IntVar::getMax((IntVar *)0x2874e4), iVar6 <= iVar5; local_6c = local_6c + 1) {
            cVar3 = Tchar::operator_cast_to_char(local_30->vals + local_6c);
            if (cVar3 != '\0') {
              if ((local_65 & 1) == 0) {
                std::operator<<(local_10,",");
              }
              local_65 = 0;
              std::ostream::operator<<(local_10,local_6c);
            }
          }
        }
        std::operator<<(local_10,"]");
        local_54 = 0;
      }
      else {
        local_54 = 4;
      }
      std::__cxx11::string::~string(local_50);
    }
  }
  local_70 = 0;
  do {
    uVar1 = local_70;
    uVar4 = vec<BoolView>::size((vec<BoolView> *)(in_RDI + 0x48));
    if (uVar4 <= uVar1) {
      std::operator<<(local_10,"}");
      return;
    }
    local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffec0,
                          CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_80);
    if (!bVar2) {
      vec<BoolView>::operator[]((vec<BoolView> *)(in_RDI + 0x48),local_70);
      __k = &local_90;
      BoolView::BoolView((BoolView *)in_stack_fffffffffffffea0,
                         (BoolView *)
                         CONCAT17(in_stack_fffffffffffffe9f,
                                  CONCAT16(in_stack_fffffffffffffe9e,
                                           CONCAT15(in_stack_fffffffffffffe9d,
                                                    in_stack_fffffffffffffe98))));
      in_stack_fffffffffffffee0 =
           std::
           map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffee0,__k);
      std::__cxx11::string::string(local_b0,(string *)in_stack_fffffffffffffee0);
      lVar10 = std::__cxx11::string::find(local_b0,0x322020);
      if (lVar10 == -1) {
        local_54 = 10;
      }
      else {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) != 0) {
          BoolView::BoolView((BoolView *)in_stack_fffffffffffffea0,
                             (BoolView *)
                             CONCAT17(in_stack_fffffffffffffe9f,
                                      CONCAT16(in_stack_fffffffffffffe9e,
                                               CONCAT15(in_stack_fffffffffffffe9d,
                                                        in_stack_fffffffffffffe98))));
          bVar2 = BoolView::getSign(&local_c0);
          BoolView::setSign(&local_c0,(bool)(~bVar2 & 1));
          in_stack_fffffffffffffec0 =
               std::
               map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffee0,__k);
          std::__cxx11::string::operator=(local_b0,(string *)in_stack_fffffffffffffec0);
          BoolView::~BoolView((BoolView *)0x28780a);
        }
        in_stack_fffffffffffffebf =
             std::operator==(in_stack_fffffffffffffea0,
                             (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                              CONCAT16(in_stack_fffffffffffffe9e,
                                                       CONCAT15(in_stack_fffffffffffffe9d,
                                                                in_stack_fffffffffffffe98))));
        if ((bool)in_stack_fffffffffffffebf) {
          local_54 = 10;
        }
        else {
          if ((local_11 & 1) == 0) {
            std::operator<<(local_10,",");
          }
          poVar11 = local_10;
          local_11 = 0;
          pmVar12 = std::
                    map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)in_stack_fffffffffffffee0,__k);
          in_stack_fffffffffffffea0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<(poVar11,(string *)pmVar12);
          std::operator<<((ostream *)in_stack_fffffffffffffea0,":");
          in_stack_fffffffffffffe9f = BoolView::isFixed((BoolView *)0x287907);
          if ((bool)in_stack_fffffffffffffe9f) {
            in_stack_fffffffffffffe9e = BoolView::isTrue((BoolView *)in_stack_fffffffffffffea0);
            if ((bool)in_stack_fffffffffffffe9e) {
              std::operator<<(local_10,"\'true\'");
            }
            else {
              in_stack_fffffffffffffe9d = BoolView::isFalse((BoolView *)in_stack_fffffffffffffea0);
              if (!(bool)in_stack_fffffffffffffe9d) {
                abort();
              }
              std::operator<<(local_10,"\'false\'");
            }
          }
          else {
            std::operator<<(local_10,"\'undef\'");
          }
          local_54 = 0;
        }
      }
      std::__cxx11::string::~string(local_b0);
      BoolView::~BoolView((BoolView *)0x2879c7);
    }
    local_70 = local_70 + 1;
  } while( true );
}

Assistant:

void printDomains(std::ostream& out = std::cout) {
		out << "{";
		bool outerFirst = true;

		for (unsigned int i = 0; i < iv.size(); i++) {
			if (iv_introduced[i]) {
				continue;
			}

			IntVar* var = iv[i];
			const std::string varName = intVarString[var];

			if (varName.empty() || varName.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << '"' << varName << '"' << ":";
			out << "[";
			if (var->vals != nullptr) {
				bool first = true;
				for (int val = var->getMin(); val <= var->getMax(); val++) {
					if (var->vals[val] != 0) {
						if (!first) {
							out << ",";
						}
						first = false;
						out << val;
					}
				}
			} else {
				out << '[' << var->getMin() << "," << var->getMax() << ']';
			}
			out << "]";
		}

		for (unsigned int i = 0; i < bv.size(); i++) {
			if (bv_introduced[i]) {
				continue;
			}

			const BoolView bview = bv[i];
			std::string bvstring = boolVarString[bview];

			if (bvstring.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			// TODO: see if this is actually necessary
			if (bvstring.empty()) {
				// Try the other value
				BoolView otherval = bview;
				otherval.setSign(!otherval.getSign());
				bvstring = boolVarString[otherval];
			}

			if (bvstring == "ASSIGNED_AT_ROOT") {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << boolVarString[bview] << ":";
			/* out << litString[toInt(bview.getLit(true))] << ":"; */
			/* out << litString[toInt(bview.getLit(false))] << ":"; */
			if (!bview.isFixed()) {
				out << "'undef'";
			} else if (bview.isTrue()) {
				out << "'true'";
			} else if (bview.isFalse()) {
				out << "'false'";
			} else {
				abort();
			}
		}
		out << "}";
	}